

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::handleLvalue
          (HlslParseContext *this,TSourceLoc *loc,char *op,TIntermTyped **node)

{
  bool bVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  TOperator TVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermBinary *swizzle;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar8;
  reference ppTVar9;
  TIntermTyped *object_00;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TIntermSymbol *pTVar10;
  TIntermTyped *lhs_00;
  undefined4 extraout_var_11;
  TIntermSymbol *pTVar11;
  undefined4 extraout_var_12;
  TIntermSymbol *lhs_01;
  TIntermNode *local_210;
  TIntermNode *local_208;
  TIntermTyped *coordTmp_2;
  TIntermSymbol *rhsTmp2;
  TIntermSymbol *rhsTmp1;
  TIntermTyped *coordTmp_1;
  TIntermSymbol *rhsTmp_1;
  TOperator assignOp_1;
  TIntermTyped *coordTmp;
  TIntermSymbol *rhsTmp;
  bool isModifyOp;
  TOperator assignOp;
  TIntermTyped *rhs;
  TType objDerefType;
  TSampler *texSampler;
  TIntermTyped *coord;
  TIntermTyped *object;
  long *plStack_f0;
  bool lhsIsSwizzle;
  TIntermAggregate *lhsAsAggregate;
  TIntermBinary *lhsAsBinary;
  anon_class_16_2_633b926d addSwizzle;
  undefined1 auStack_c8 [7];
  anon_class_1_0_00000001 writesAllComponents;
  anon_class_24_3_9f5bceca makeUnary;
  anon_class_24_3_9f5bceca finishSequence;
  anon_class_24_3_9f5bceca makeBinary;
  anon_class_24_3_d1780b14 makeStore;
  anon_class_24_3_c560d4ac makeLoad;
  TIntermTyped *lhs;
  TIntermAggregate *sequence;
  TIntermUnary *nodeAsUnary;
  TIntermBinary *nodeAsBinary;
  TIntermTyped **node_local;
  char *op_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  undefined4 extraout_var_02;
  undefined4 extraout_var_05;
  
  if (*node == (TIntermTyped *)0x0) {
    return (TIntermTyped *)(HlslParseContext *)0x0;
  }
  nodeAsBinary = (TIntermBinary *)node;
  node_local = (TIntermTyped **)op;
  op_local = (char *)loc;
  loc_local = (TSourceLoc *)this;
  iVar4 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[8])();
  nodeAsUnary = (TIntermUnary *)CONCAT44(extraout_var,iVar4);
  sequence = (TIntermAggregate *)
             (**(code **)(*(nodeAsBinary->super_TIntermOperator).super_TIntermTyped.
                           super_TIntermNode._vptr_TIntermNode + 0x38))();
  lhs = (TIntermTyped *)0x0;
  if (sequence == (TIntermAggregate *)0x0) {
    if (nodeAsUnary == (TIntermUnary *)0x0) {
      local_210 = (TIntermNode *)0x0;
    }
    else {
      iVar4 = (*(nodeAsUnary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      local_210 = (TIntermNode *)CONCAT44(extraout_var_01,iVar4);
    }
    local_208 = local_210;
  }
  else {
    iVar4 = (*(sequence->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x31])();
    local_208 = (TIntermNode *)CONCAT44(extraout_var_00,iVar4);
  }
  bVar3 = shouldConvertLValue(this,local_208);
  if (!bVar3) {
    if ((local_208 != (TIntermNode *)0x0) &&
       (uVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x42])
                          (this,op_local,node_local,local_208), (uVar5 & 1) != 0)) {
      return (TIntermTyped *)(HlslParseContext *)0x0;
    }
    return (TIntermTyped *)
           (HlslParseContext *)
           (nodeAsBinary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
           _vptr_TIntermNode;
  }
  makeStore.sequence = (TIntermAggregate **)op_local;
  makeStore.this = (HlslParseContext *)op_local;
  makeStore.loc = (TSourceLoc *)&lhs;
  finishSequence.loc = (TSourceLoc *)&lhs;
  makeBinary.this = (HlslParseContext *)op_local;
  makeUnary.loc = (TSourceLoc *)&lhs;
  finishSequence.this = (HlslParseContext *)op_local;
  _auStack_c8 = (TIntermAggregate **)&lhs;
  makeUnary.this = (HlslParseContext *)op_local;
  addSwizzle.this = (HlslParseContext *)op_local;
  lhsAsBinary = (TIntermBinary *)this;
  makeUnary.sequence = (TIntermAggregate **)this;
  finishSequence.sequence = (TIntermAggregate **)this;
  makeBinary.sequence = (TIntermAggregate **)this;
  makeBinary.loc = (TSourceLoc *)this;
  iVar4 = (*local_208->_vptr_TIntermNode[8])();
  swizzle = (TIntermBinary *)CONCAT44(extraout_var_02,iVar4);
  iVar4 = (*local_208->_vptr_TIntermNode[6])();
  plStack_f0 = (long *)CONCAT44(extraout_var_03,iVar4);
  bVar3 = false;
  if ((swizzle != (TIntermBinary *)0x0) &&
     ((TVar6 = TIntermOperator::getOp((TIntermOperator *)swizzle), TVar6 == EOpVectorSwizzle ||
      (TVar6 = TIntermOperator::getOp((TIntermOperator *)swizzle), TVar6 == EOpIndexDirect)))) {
    iVar4 = (*(swizzle->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])();
    plStack_f0 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0x30))();
    bVar3 = true;
  }
  pvVar8 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
           (**(code **)(*plStack_f0 + 400))();
  ppTVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                      (pvVar8,0);
  iVar4 = (*(*ppTVar9)->_vptr_TIntermNode[3])();
  object_00 = (TIntermTyped *)CONCAT44(extraout_var_05,iVar4);
  pvVar8 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
           (**(code **)(*plStack_f0 + 400))();
  ppTVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                      (pvVar8,1);
  iVar4 = (*(*ppTVar9)->_vptr_TIntermNode[3])();
  _assignOp_1 = (TIntermSymbol *)CONCAT44(extraout_var_06,iVar4);
  iVar4 = (*(object_00->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  objDerefType.spirvType =
       (TSpirvType *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 0x40))();
  TType::TType((TType *)&rhs,EbtVoid,EvqTemporary,1,0,0,false);
  getTextureReturnType(this,(TSampler *)objDerefType.spirvType,(TType *)&rhs);
  if (nodeAsUnary != (TIntermUnary *)0x0) {
    iVar4 = (*(nodeAsUnary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x33])();
    TVar6 = TIntermOperator::getOp(&nodeAsUnary->super_TIntermOperator);
    bVar1 = false;
    if (TVar6 != EOpAssign) {
      if (0xd < TVar6 - EOpAddAssign) goto LAB_00628394;
      bVar1 = true;
    }
    iVar7 = (*(((TIntermTyped *)CONCAT44(extraout_var_08,iVar4))->super_TIntermNode).
              _vptr_TIntermNode[0xc])();
    coordTmp = (TIntermTyped *)CONCAT44(extraout_var_09,iVar7);
    if (((coordTmp == (TIntermTyped *)0x0) || (bVar1)) || (bVar3)) {
      coordTmp = &makeInternalVariableNode(this,(TSourceLoc *)op_local,"storeTemp",(TType *)&rhs)->
                  super_TIntermTyped;
      bVar3 = handleLvalue::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&addSwizzle.loc + 7),
                         (TIntermSymbol *)coordTmp,swizzle);
      if (!bVar3) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,op_local,"unimplemented: partial image updates","");
      }
      pcVar2 = op_local;
      if (bVar1) {
        iVar7 = (*(_assignOp_1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
        pTVar10 = makeInternalVariableNode
                            (this,(TSourceLoc *)pcVar2,"coordTemp",
                             (TType *)CONCAT44(extraout_var_10,iVar7));
        handleLvalue::anon_class_24_3_9f5bceca::operator()
                  ((anon_class_24_3_9f5bceca *)&finishSequence.loc,EOpAssign,
                   &pTVar10->super_TIntermTyped,(TIntermTyped *)_assignOp_1);
        handleLvalue::anon_class_24_3_c560d4ac::operator()
                  ((anon_class_24_3_c560d4ac *)&makeStore.sequence,(TIntermSymbol *)coordTmp,
                   object_00,&pTVar10->super_TIntermTyped,(TType *)&rhs);
        _assignOp_1 = pTVar10;
      }
      pTVar10 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           (TIntermSymbol *)coordTmp);
      lhs_00 = handleLvalue::anon_class_16_2_633b926d::operator()
                         ((anon_class_16_2_633b926d *)&lhsAsBinary,pTVar10,swizzle);
      handleLvalue::anon_class_24_3_9f5bceca::operator()
                ((anon_class_24_3_9f5bceca *)&finishSequence.loc,TVar6,lhs_00,
                 (TIntermTyped *)CONCAT44(extraout_var_08,iVar4));
    }
    handleLvalue::anon_class_24_3_d1780b14::operator()
              ((anon_class_24_3_d1780b14 *)&makeBinary.loc,object_00,
               &_assignOp_1->super_TIntermTyped,(TIntermSymbol *)coordTmp);
    this_local = (HlslParseContext *)
                 handleLvalue::anon_class_24_3_9f5bceca::operator()
                           ((anon_class_24_3_9f5bceca *)&makeUnary.loc,(TIntermSymbol *)coordTmp,
                            (TType *)&rhs);
    goto LAB_0062868d;
  }
LAB_00628394:
  if (sequence != (TIntermAggregate *)0x0) {
    TVar6 = TIntermOperator::getOp(&sequence->super_TIntermOperator);
    if (TVar6 - EOpPostIncrement < 2) {
      pTVar10 = makeInternalVariableNode(this,(TSourceLoc *)op_local,"storeTempPre",(TType *)&rhs);
      pTVar11 = makeInternalVariableNode(this,(TSourceLoc *)op_local,"storeTempPost",(TType *)&rhs);
      pcVar2 = op_local;
      iVar4 = (*(_assignOp_1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      lhs_01 = makeInternalVariableNode
                         (this,(TSourceLoc *)pcVar2,"coordTemp",
                          (TType *)CONCAT44(extraout_var_12,iVar4));
      handleLvalue::anon_class_24_3_9f5bceca::operator()
                ((anon_class_24_3_9f5bceca *)&finishSequence.loc,EOpAssign,
                 &lhs_01->super_TIntermTyped,(TIntermTyped *)_assignOp_1);
      handleLvalue::anon_class_24_3_c560d4ac::operator()
                ((anon_class_24_3_c560d4ac *)&makeStore.sequence,pTVar10,object_00,
                 &lhs_01->super_TIntermTyped,(TType *)&rhs);
      handleLvalue::anon_class_24_3_9f5bceca::operator()
                ((anon_class_24_3_9f5bceca *)&finishSequence.loc,EOpAssign,
                 &pTVar11->super_TIntermTyped,&pTVar10->super_TIntermTyped);
      handleLvalue::anon_class_24_3_9f5bceca::operator()
                ((anon_class_24_3_9f5bceca *)auStack_c8,TVar6,pTVar11);
      handleLvalue::anon_class_24_3_d1780b14::operator()
                ((anon_class_24_3_d1780b14 *)&makeBinary.loc,object_00,&lhs_01->super_TIntermTyped,
                 pTVar11);
      this_local = (HlslParseContext *)
                   handleLvalue::anon_class_24_3_9f5bceca::operator()
                             ((anon_class_24_3_9f5bceca *)&makeUnary.loc,pTVar10,(TType *)&rhs);
      goto LAB_0062868d;
    }
    if (TVar6 == EOpPreIncrement || TVar6 == EOpPreDecrement) {
      pTVar10 = makeInternalVariableNode(this,(TSourceLoc *)op_local,"storeTemp",(TType *)&rhs);
      pcVar2 = op_local;
      iVar4 = (*(_assignOp_1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      pTVar11 = makeInternalVariableNode
                          (this,(TSourceLoc *)pcVar2,"coordTemp",
                           (TType *)CONCAT44(extraout_var_11,iVar4));
      handleLvalue::anon_class_24_3_9f5bceca::operator()
                ((anon_class_24_3_9f5bceca *)&finishSequence.loc,EOpAssign,
                 &pTVar11->super_TIntermTyped,(TIntermTyped *)_assignOp_1);
      handleLvalue::anon_class_24_3_c560d4ac::operator()
                ((anon_class_24_3_c560d4ac *)&makeStore.sequence,pTVar10,object_00,
                 &pTVar11->super_TIntermTyped,(TType *)&rhs);
      handleLvalue::anon_class_24_3_9f5bceca::operator()
                ((anon_class_24_3_9f5bceca *)auStack_c8,TVar6,pTVar10);
      handleLvalue::anon_class_24_3_d1780b14::operator()
                ((anon_class_24_3_d1780b14 *)&makeBinary.loc,object_00,&pTVar11->super_TIntermTyped,
                 pTVar10);
      this_local = (HlslParseContext *)
                   handleLvalue::anon_class_24_3_9f5bceca::operator()
                             ((anon_class_24_3_9f5bceca *)&makeUnary.loc,pTVar10,(TType *)&rhs);
      goto LAB_0062868d;
    }
  }
  if ((local_208 == (TIntermNode *)0x0) ||
     (uVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x42])
                        (this,op_local,node_local,local_208), (uVar5 & 1) == 0)) {
    this_local = (HlslParseContext *)
                 (nodeAsBinary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode;
  }
  else {
    this_local = (HlslParseContext *)0x0;
  }
LAB_0062868d:
  TType::~TType((TType *)&rhs);
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* HlslParseContext::handleLvalue(const TSourceLoc& loc, const char* op, TIntermTyped*& node)
{
    if (node == nullptr)
        return nullptr;

    TIntermBinary* nodeAsBinary = node->getAsBinaryNode();
    TIntermUnary* nodeAsUnary = node->getAsUnaryNode();
    TIntermAggregate* sequence = nullptr;

    TIntermTyped* lhs = nodeAsUnary  ? nodeAsUnary->getOperand() :
                        nodeAsBinary ? nodeAsBinary->getLeft() :
                        nullptr;

    // Early bail out if there is no conversion to apply
    if (!shouldConvertLValue(lhs)) {
        if (lhs != nullptr)
            if (lValueErrorCheck(loc, op, lhs))
                return nullptr;
        return node;
    }

    // *** If we get here, we're going to apply some conversion to an l-value.

    // Helper to create a load.
    const auto makeLoad = [&](TIntermSymbol* rhsTmp, TIntermTyped* object, TIntermTyped* coord, const TType& derefType) {
        TIntermAggregate* loadOp = new TIntermAggregate(EOpImageLoad);
        loadOp->setLoc(loc);
        loadOp->getSequence().push_back(object);
        loadOp->getSequence().push_back(intermediate.addSymbol(*coord->getAsSymbolNode()));
        loadOp->setType(derefType);

        sequence = intermediate.growAggregate(sequence,
                                              intermediate.addAssign(EOpAssign, rhsTmp, loadOp, loc),
                                              loc);
    };

    // Helper to create a store.
    const auto makeStore = [&](TIntermTyped* object, TIntermTyped* coord, TIntermSymbol* rhsTmp) {
        TIntermAggregate* storeOp = new TIntermAggregate(EOpImageStore);
        storeOp->getSequence().push_back(object);
        storeOp->getSequence().push_back(coord);
        storeOp->getSequence().push_back(intermediate.addSymbol(*rhsTmp));
        storeOp->setLoc(loc);
        storeOp->setType(TType(EbtVoid));

        sequence = intermediate.growAggregate(sequence, storeOp);
    };

    // Helper to create an assign.
    const auto makeBinary = [&](TOperator op, TIntermTyped* lhs, TIntermTyped* rhs) {
        sequence = intermediate.growAggregate(sequence,
                                              intermediate.addBinaryNode(op, lhs, rhs, loc, lhs->getType()),
                                              loc);
    };

    // Helper to complete sequence by adding trailing variable, so we evaluate to the right value.
    const auto finishSequence = [&](TIntermSymbol* rhsTmp, const TType& derefType) -> TIntermAggregate* {
        // Add a trailing use of the temp, so the sequence returns the proper value.
        sequence = intermediate.growAggregate(sequence, intermediate.addSymbol(*rhsTmp));
        sequence->setOperator(EOpSequence);
        sequence->setLoc(loc);
        sequence->setType(derefType);

        return sequence;
    };

    // Helper to add unary op
    const auto makeUnary = [&](TOperator op, TIntermSymbol* rhsTmp) {
        sequence = intermediate.growAggregate(sequence,
                                              intermediate.addUnaryNode(op, intermediate.addSymbol(*rhsTmp), loc,
                                                                        rhsTmp->getType()),
                                              loc);
    };

    // Return true if swizzle or index writes all components of the given variable.
    const auto writesAllComponents = [&](TIntermSymbol* var, TIntermBinary* swizzle) -> bool {
        if (swizzle == nullptr)  // not a swizzle or index
            return true;

        // Track which components are being set.
        std::array<bool, 4> compIsSet;
        compIsSet.fill(false);

        const TIntermConstantUnion* asConst     = swizzle->getRight()->getAsConstantUnion();
        const TIntermAggregate*     asAggregate = swizzle->getRight()->getAsAggregate();

        // This could be either a direct index, or a swizzle.
        if (asConst) {
            compIsSet[asConst->getConstArray()[0].getIConst()] = true;
        } else if (asAggregate) {
            const TIntermSequence& seq = asAggregate->getSequence();
            for (int comp=0; comp<int(seq.size()); ++comp)
                compIsSet[seq[comp]->getAsConstantUnion()->getConstArray()[0].getIConst()] = true;
        } else {
            assert(0);
        }

        // Return true if all components are being set by the index or swizzle
        return std::all_of(compIsSet.begin(), compIsSet.begin() + var->getType().getVectorSize(),
                           [](bool isSet) { return isSet; } );
    };

    // Create swizzle matching input swizzle
    const auto addSwizzle = [&](TIntermSymbol* var, TIntermBinary* swizzle) -> TIntermTyped* {
        if (swizzle)
            return intermediate.addBinaryNode(swizzle->getOp(), var, swizzle->getRight(), loc, swizzle->getType());
        else
            return var;
    };

    TIntermBinary*    lhsAsBinary    = lhs->getAsBinaryNode();
    TIntermAggregate* lhsAsAggregate = lhs->getAsAggregate();
    bool lhsIsSwizzle = false;

    // If it's a swizzled L-value, remember the swizzle, and use the LHS.
    if (lhsAsBinary != nullptr && (lhsAsBinary->getOp() == EOpVectorSwizzle || lhsAsBinary->getOp() == EOpIndexDirect)) {
        lhsAsAggregate = lhsAsBinary->getLeft()->getAsAggregate();
        lhsIsSwizzle = true;
    }

    TIntermTyped* object = lhsAsAggregate->getSequence()[0]->getAsTyped();
    TIntermTyped* coord  = lhsAsAggregate->getSequence()[1]->getAsTyped();

    const TSampler& texSampler = object->getType().getSampler();

    TType objDerefType;
    getTextureReturnType(texSampler, objDerefType);

    if (nodeAsBinary) {
        TIntermTyped* rhs = nodeAsBinary->getRight();
        const TOperator assignOp = nodeAsBinary->getOp();

        bool isModifyOp = false;

        switch (assignOp) {
        case EOpAddAssign:
        case EOpSubAssign:
        case EOpMulAssign:
        case EOpVectorTimesMatrixAssign:
        case EOpVectorTimesScalarAssign:
        case EOpMatrixTimesScalarAssign:
        case EOpMatrixTimesMatrixAssign:
        case EOpDivAssign:
        case EOpModAssign:
        case EOpAndAssign:
        case EOpInclusiveOrAssign:
        case EOpExclusiveOrAssign:
        case EOpLeftShiftAssign:
        case EOpRightShiftAssign:
            isModifyOp = true;
            [[fallthrough]];
        case EOpAssign:
            {
                // Since this is an lvalue, we'll convert an image load to a sequence like this
                // (to still provide the value):
                //   OpSequence
                //      OpImageStore(object, lhs, rhs)
                //      rhs
                // But if it's not a simple symbol RHS (say, a fn call), we don't want to duplicate the RHS,
                // so we'll convert instead to this:
                //   OpSequence
                //      rhsTmp = rhs
                //      OpImageStore(object, coord, rhsTmp)
                //      rhsTmp
                // If this is a read-modify-write op, like +=, we issue:
                //   OpSequence
                //      coordtmp = load's param1
                //      rhsTmp = OpImageLoad(object, coordTmp)
                //      rhsTmp op= rhs
                //      OpImageStore(object, coordTmp, rhsTmp)
                //      rhsTmp
                //
                // If the lvalue is swizzled, we apply that when writing the temp variable, like so:
                //    ...
                //    rhsTmp.some_swizzle = ...
                // For partial writes, an error is generated.

                TIntermSymbol* rhsTmp = rhs->getAsSymbolNode();
                TIntermTyped* coordTmp = coord;

                if (rhsTmp == nullptr || isModifyOp || lhsIsSwizzle) {
                    rhsTmp = makeInternalVariableNode(loc, "storeTemp", objDerefType);

                    // Partial updates not yet supported
                    if (!writesAllComponents(rhsTmp, lhsAsBinary)) {
                        error(loc, "unimplemented: partial image updates", "", "");
                    }

                    // Assign storeTemp = rhs
                    if (isModifyOp) {
                        // We have to make a temp var for the coordinate, to avoid evaluating it twice.
                        coordTmp = makeInternalVariableNode(loc, "coordTemp", coord->getType());
                        makeBinary(EOpAssign, coordTmp, coord); // coordtmp = load[param1]
                        makeLoad(rhsTmp, object, coordTmp, objDerefType); // rhsTmp = OpImageLoad(object, coordTmp)
                    }

                    // rhsTmp op= rhs.
                    makeBinary(assignOp, addSwizzle(intermediate.addSymbol(*rhsTmp), lhsAsBinary), rhs);
                }

                makeStore(object, coordTmp, rhsTmp);         // add a store
                return finishSequence(rhsTmp, objDerefType); // return rhsTmp from sequence
            }

        default:
            break;
        }
    }

    if (nodeAsUnary) {
        const TOperator assignOp = nodeAsUnary->getOp();

        switch (assignOp) {
        case EOpPreIncrement:
        case EOpPreDecrement:
            {
                // We turn this into:
                //   OpSequence
                //      coordtmp = load's param1
                //      rhsTmp = OpImageLoad(object, coordTmp)
                //      rhsTmp op
                //      OpImageStore(object, coordTmp, rhsTmp)
                //      rhsTmp

                TIntermSymbol* rhsTmp = makeInternalVariableNode(loc, "storeTemp", objDerefType);
                TIntermTyped* coordTmp = makeInternalVariableNode(loc, "coordTemp", coord->getType());

                makeBinary(EOpAssign, coordTmp, coord);           // coordtmp = load[param1]
                makeLoad(rhsTmp, object, coordTmp, objDerefType); // rhsTmp = OpImageLoad(object, coordTmp)
                makeUnary(assignOp, rhsTmp);                      // op rhsTmp
                makeStore(object, coordTmp, rhsTmp);              // OpImageStore(object, coordTmp, rhsTmp)
                return finishSequence(rhsTmp, objDerefType);      // return rhsTmp from sequence
            }

        case EOpPostIncrement:
        case EOpPostDecrement:
            {
                // We turn this into:
                //   OpSequence
                //      coordtmp = load's param1
                //      rhsTmp1 = OpImageLoad(object, coordTmp)
                //      rhsTmp2 = rhsTmp1
                //      rhsTmp2 op
                //      OpImageStore(object, coordTmp, rhsTmp2)
                //      rhsTmp1 (pre-op value)
                TIntermSymbol* rhsTmp1 = makeInternalVariableNode(loc, "storeTempPre",  objDerefType);
                TIntermSymbol* rhsTmp2 = makeInternalVariableNode(loc, "storeTempPost", objDerefType);
                TIntermTyped* coordTmp = makeInternalVariableNode(loc, "coordTemp", coord->getType());

                makeBinary(EOpAssign, coordTmp, coord);            // coordtmp = load[param1]
                makeLoad(rhsTmp1, object, coordTmp, objDerefType); // rhsTmp1 = OpImageLoad(object, coordTmp)
                makeBinary(EOpAssign, rhsTmp2, rhsTmp1);           // rhsTmp2 = rhsTmp1
                makeUnary(assignOp, rhsTmp2);                      // rhsTmp op
                makeStore(object, coordTmp, rhsTmp2);              // OpImageStore(object, coordTmp, rhsTmp2)
                return finishSequence(rhsTmp1, objDerefType);      // return rhsTmp from sequence
            }

        default:
            break;
        }
    }

    if (lhs)
        if (lValueErrorCheck(loc, op, lhs))
            return nullptr;

    return node;
}